

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManComputeOverlap2(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Str_t *p_01;
  int iVar3;
  
  if (p->vMapping != (Vec_Int_t *)0x0) {
    iVar1 = Gia_ManAndNum(p);
    iVar1 = -iVar1;
    p_00 = Vec_IntAlloc(100);
    iVar3 = p->nObjs;
    p_01 = Vec_StrAlloc(iVar3);
    p_01->nSize = iVar3;
    memset(p_01->pArray,0,(long)iVar3);
    for (iVar3 = 1; iVar3 < p->nObjs; iVar3 = iVar3 + 1) {
      iVar2 = Gia_ObjIsLut(p,iVar3);
      if (iVar2 != 0) {
        iVar2 = Gia_ManComputeOverlap2One(p,iVar3,p_01,p_00);
        iVar1 = iVar1 + iVar2;
      }
    }
    Vec_StrFree(p_01);
    Vec_IntFree(p_00);
    return iVar1;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                ,0x14b,"int Gia_ManComputeOverlap2(Gia_Man_t *)");
}

Assistant:

int Gia_ManComputeOverlap2( Gia_Man_t * p )
{
    Vec_Int_t * vVisit;
    Vec_Str_t * vLabel;
    int i, Count = -Gia_ManAndNum(p);
    assert( Gia_ManHasMapping(p) );
    vVisit = Vec_IntAlloc( 100 );
    vLabel = Vec_StrStart( Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
        Count += Gia_ManComputeOverlap2One( p, i, vLabel, vVisit );
    Vec_StrFree( vLabel );
    Vec_IntFree( vVisit );
    return Count;
}